

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec_random.cpp
# Opt level: O1

result_type_conflict __thiscall SecRandom::operator()(SecRandom *this)

{
  ssize_t sVar1;
  int *piVar2;
  result_type_conflict *__buf;
  size_t __nbytes;
  result_type_conflict r;
  result_type_conflict local_19;
  
  __buf = &local_19;
  __nbytes = 1;
  do {
    sVar1 = read(this->fd_,__buf,__nbytes);
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        anon_unknown.dwarf_515b::__throw_system_error
                  (*piVar2,"random_device got an unexpected error");
        goto LAB_0010269c;
      }
    }
    else {
      if (sVar1 == 0) {
LAB_0010269c:
        anon_unknown.dwarf_515b::__throw_system_error(0x3d,"random_device got EOF");
        __cxa_begin_catch();
        std::terminate();
      }
      __nbytes = __nbytes - sVar1;
      __buf = __buf + sVar1;
    }
    if (__nbytes == 0) {
      return local_19;
    }
  } while( true );
}

Assistant:

SecRandom::result_type SecRandom::operator()()
{
  result_type r;
  size_t n = sizeof(r);
  char* p = reinterpret_cast<char*>(&r);
  while (n > 0)
  {
    ssize_t s = read(fd_, p, n);
    if (s == 0)
      __throw_system_error(ENODATA, "random_device got EOF");
    if (s == -1) 
    {   
      if (errno != EINTR)
        __throw_system_error(errno, "random_device got an unexpected error");
      continue;
    }   
    n -= static_cast<size_t>(s);
    p += static_cast<size_t>(s);
  }
  return r;
}